

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O2

void __thiscall
Eigen::internal::
solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst)

{
  long lVar1;
  MatrixType *pMVar2;
  MatrixType *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar1 = *(long *)(this + 8);
  pMVar2 = PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixLU
                     (*(PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
  if (lVar1 == (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows) {
    local_40 = (MatrixType *)
               PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::permutationP
                         (*(PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
    local_38 = *(undefined8 *)(this + 8);
    uStack_30 = *(undefined8 *)(this + 0x10);
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)dst,
               (ReturnByValue<Eigen::internal::permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>_>
                *)&local_40);
    local_40 = PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixLU
                         (*(PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
    TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,5u>::
    solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,5u> *)&local_40,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
    local_40 = PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixLU
                         (*(PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> **)this);
    TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,2u>::
    solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,2u> *)&local_40,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
    return;
  }
  __assert_fail("rhs().rows() == dec().matrixLU().rows()",
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/LU/PartialPivLU.h"
                ,0x1cc,
                "void Eigen::internal::solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>, Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>>::evalTo(Dest &) const [DecompositionType = Eigen::PartialPivLU<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void evalTo(Dest& dst) const
  {
    /* The decomposition PA = LU can be rewritten as A = P^{-1} L U.
    * So we proceed as follows:
    * Step 1: compute c = Pb.
    * Step 2: replace c by the solution x to Lx = c.
    * Step 3: replace c by the solution x to Ux = c.
    */

    eigen_assert(rhs().rows() == dec().matrixLU().rows());

    // Step 1
    dst = dec().permutationP() * rhs();

    // Step 2
    dec().matrixLU().template triangularView<UnitLower>().solveInPlace(dst);

    // Step 3
    dec().matrixLU().template triangularView<Upper>().solveInPlace(dst);
  }